

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_317c8b::ConvolveTestBase::SpeedTest(ConvolveTestBase *this)

{
  uint uVar1;
  uint output_width;
  int16_t *piVar2;
  ConvolveFunc p_Var3;
  undefined8 uVar4;
  byte bVar5;
  uint16_t uVar6;
  ushort uVar7;
  int iVar8;
  uint8_t *src_ptr;
  uint8_t *puVar9;
  ParamType *pPVar10;
  int64_t iVar11;
  uint i;
  uint uVar12;
  uint8_t *puVar13;
  uint i_1;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int x;
  long lVar19;
  bool bVar20;
  uint16_t in_FPULastInstructionOpcode;
  undefined8 in_FPUInstructionPointer;
  uint output_height;
  int in_stack_ffffffffffff7f68;
  int local_8078;
  ACMRandom prng;
  RegisterStateCheckMMX reg_check_mmx;
  aom_usec_timer timer;
  
  src_ptr = input(this);
  puVar9 = output(this);
  uVar14 = (anonymous_namespace)::ConvolveTestBase::ref8_;
  if (this->UUT_->use_highbd_ != 0) {
    uVar14 = (anonymous_namespace)::ConvolveTestBase::ref16_ >> 1;
  }
  prng.random_.state_ = (Random)0xbaba;
  lVar18 = (long)puVar9 * 2;
  lVar17 = 0;
  do {
    pPVar10 = testing::
              WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
              ::GetParam();
    if ((pPVar10->super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
        ).super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
        super__Head_base<1UL,_int,_false>._M_head_impl <= lVar17) {
      pPVar10 = testing::
                WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                ::GetParam();
      uVar1 = *(uint *)&(pPVar10->
                        super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                        ).
                        super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                        .field_0xc;
      output_height = 0x44dd55;
      pPVar10 = testing::
                WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                ::GetParam();
      output_width = (pPVar10->
                     super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                     ).super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                     .super__Head_base<1UL,_int,_false>._M_head_impl;
      uVar12 = this->UUT_->use_highbd_;
      if (uVar12 == 0) {
        filter_block2d_8_c(src_ptr,0xa88d10,av1_sub_pel_filters_8smooth[1],(int16_t *)&timer,
                           (uint8_t *)0x80,uVar1,output_width,output_height);
        iVar8 = 0;
        puVar13 = puVar9;
        for (uVar12 = 0; uVar12 != output_width; uVar12 = uVar12 + 1) {
          for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
            puVar13[uVar14] =
                 (uint8_t)((uint)puVar13[uVar14] +
                           (uint)*(byte *)((long)&timer.begin.tv_sec +
                                          (ulong)(uint)(iVar8 + (int)uVar14)) + 1 >> 1);
          }
          puVar13 = puVar13 + 0x200;
          iVar8 = iVar8 + 0x80;
        }
      }
      else {
        highbd_filter_block2d_8_c
                  ((uint16_t *)((long)src_ptr * 2),0xa88d10,av1_sub_pel_filters_8smooth[1],
                   (int16_t *)&timer,(uint16_t *)0x80,uVar1,output_width,uVar12,
                   in_stack_ffffffffffff7f68);
        iVar8 = 0;
        for (uVar12 = 0; uVar12 != output_width; uVar12 = uVar12 + 1) {
          for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
            *(short *)(lVar18 + uVar14 * 2) =
                 (short)((uint)*(ushort *)(lVar18 + uVar14 * 2) +
                         (uint)*(ushort *)
                                ((long)&timer.begin.tv_sec + (ulong)(uint)(iVar8 + (int)uVar14) * 2)
                         + 1 >> 1);
          }
          lVar18 = lVar18 + 0x400;
          iVar8 = iVar8 + 0x80;
        }
      }
      ::aom_usec_timer_start(&timer);
      local_8078 = 1000;
      do {
        bVar20 = local_8078 == 0;
        local_8078 = local_8078 + -1;
        if (bVar20) {
          ::aom_usec_timer_mark(&timer);
          iVar11 = ::aom_usec_timer_elapsed(&timer);
          pPVar10 = testing::
                    WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                    ::GetParam();
          uVar1 = *(uint *)&(pPVar10->
                            super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                            ).
                            super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                            .field_0xc;
          pPVar10 = testing::
                    WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                    ::GetParam();
          printf("%dx%d (bitdepth %d) time: %5d ms\n",(ulong)uVar1,
                 (ulong)(uint)(pPVar10->
                              super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                              ).
                              super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                              .super__Head_base<1UL,_int,_false>._M_head_impl,
                 (ulong)(uint)this->UUT_->use_highbd_,iVar11 / 1000 & 0xffffffff);
          return;
        }
        for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
          piVar2 = av1_interp_filter_params_list[lVar18].filter_ptr;
          for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
            for (lVar16 = 0; uVar4 = reg_check_mmx.pre_fpu_env_._12_8_, lVar16 != 0x100;
                lVar16 = lVar16 + 0x10) {
              if (lVar17 == 0 || lVar16 == 0) {
                reg_check_mmx.pre_fpu_env_._12_6_ = SUB86(in_FPUInstructionPointer,0);
                if (lVar16 == 0) {
                  if (lVar17 == 0) goto LAB_0044df68;
                  reg_check_mmx.pre_fpu_env_[9] = in_FPULastInstructionOpcode;
                  p_Var3 = this->UUT_->h8_;
                  pPVar10 = testing::
                            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                            ::GetParam();
                  iVar8 = *(int *)&(pPVar10->
                                   super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                   ).
                                   super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                   .field_0xc;
                  pPVar10 = testing::
                            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                            ::GetParam();
                  (*p_Var3)(src_ptr,0x200,puVar9,0x200,piVar2 + lVar17 * 8,0x10,
                            (int16_t *)(anonymous_namespace)::kInvalidFilter,0x10,iVar8,
                            (pPVar10->
                            super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                            ).
                            super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                            .super__Head_base<1UL,_int,_false>._M_head_impl);
                }
                else {
                  reg_check_mmx.pre_fpu_env_[9] = in_FPULastInstructionOpcode;
                  p_Var3 = this->UUT_->v8_;
                  pPVar10 = testing::
                            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                            ::GetParam();
                  iVar8 = *(int *)&(pPVar10->
                                   super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                   ).
                                   super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                                   .field_0xc;
                  pPVar10 = testing::
                            WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                            ::GetParam();
                  (*p_Var3)(src_ptr,0x200,puVar9,0x200,
                            (int16_t *)(anonymous_namespace)::kInvalidFilter,0x10,
                            (int16_t *)((long)piVar2 + lVar16),0x10,iVar8,
                            (pPVar10->
                            super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                            ).
                            super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                            .super__Head_base<1UL,_int,_false>._M_head_impl);
                }
                libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
                uVar4 = reg_check_mmx.pre_fpu_env_._12_8_;
              }
LAB_0044df68:
              reg_check_mmx.pre_fpu_env_._12_8_ = uVar4;
            }
          }
        }
      } while( true );
    }
    uVar15 = (ulong)((uint)lVar17 << 9);
    lVar16 = (ulong)((uint)lVar17 & 0x7fffff) * 0x400;
    for (lVar19 = 0;
        pPVar10 = testing::
                  WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
                  ::GetParam(),
        lVar19 < *(int *)&(pPVar10->
                          super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                          ).
                          super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>
                          .field_0xc; lVar19 = lVar19 + 1) {
      if ((this->UUT_->use_highbd_ & 0xfffffff7U) == 0) {
        bVar5 = libaom_test::ACMRandom::Rand8Extremes(&prng);
        uVar7 = (ushort)bVar5;
      }
      else {
        uVar6 = libaom_test::ACMRandom::Rand16(&prng);
        uVar7 = uVar6 & (ushort)this->mask_;
      }
      if (this->UUT_->use_highbd_ == 0) {
        puVar9[lVar19 + uVar15] = (uint8_t)uVar7;
        if (this->UUT_->use_highbd_ != 0) goto LAB_0044dd20;
        *(uint8_t *)(uVar14 + uVar15 + lVar19) = (uint8_t)uVar7;
      }
      else {
        *(ushort *)(lVar16 + lVar18 + lVar19 * 2) = uVar7;
LAB_0044dd20:
        *(ushort *)(uVar14 * 2 + lVar16 + lVar19 * 2) = uVar7;
      }
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void SpeedTest() {
    uint8_t *const in = input();
    uint8_t *const out = output();
    uint8_t *ref;
    if (UUT_->use_highbd_ == 0) {
      ref = ref8_;
    } else {
      ref = CONVERT_TO_BYTEPTR(ref16_);
    }

    // Populate ref and out with some random data
    ::libaom_test::ACMRandom prng;
    for (int y = 0; y < Height(); ++y) {
      for (int x = 0; x < Width(); ++x) {
        uint16_t r;
        if (UUT_->use_highbd_ == 0 || UUT_->use_highbd_ == 8) {
          r = prng.Rand8Extremes();
        } else {
          r = prng.Rand16() & mask_;
        }
        assign_val(out, y * kOutputStride + x, r);
        assign_val(ref, y * kOutputStride + x, r);
      }
    }

    InterpFilter filter = (InterpFilter)1;
    const InterpKernel *filters =
        (const InterpKernel *)av1_get_interp_filter_kernel(filter, USE_8_TAPS);
    wrapper_filter_average_block2d_8_c(in, kInputStride, filters[1], filters[1],
                                       out, kOutputStride, Width(), Height());

    aom_usec_timer timer;
    int tests_num = 1000;

    aom_usec_timer_start(&timer);
    while (tests_num > 0) {
      for (int filter_bank = 0; filter_bank < kNumFilterBanks; ++filter_bank) {
        filter = (InterpFilter)filter_bank;
        filters = (const InterpKernel *)av1_get_interp_filter_kernel(
            filter, USE_8_TAPS);
        for (int filter_x = 0; filter_x < kNumFilters; ++filter_x) {
          for (int filter_y = 0; filter_y < kNumFilters; ++filter_y) {
            if (filter_x && filter_y) continue;
            if (filter_y)
              API_REGISTER_STATE_CHECK(UUT_->v8_(
                  in, kInputStride, out, kOutputStride, kInvalidFilter, 16,
                  filters[filter_y], 16, Width(), Height()));
            else if (filter_x)
              API_REGISTER_STATE_CHECK(UUT_->h8_(
                  in, kInputStride, out, kOutputStride, filters[filter_x], 16,
                  kInvalidFilter, 16, Width(), Height()));
          }
        }
      }
      tests_num--;
    }
    aom_usec_timer_mark(&timer);

    const int elapsed_time =
        static_cast<int>(aom_usec_timer_elapsed(&timer) / 1000);
    printf("%dx%d (bitdepth %d) time: %5d ms\n", Width(), Height(),
           UUT_->use_highbd_, elapsed_time);
  }